

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O0

uint8_t * __thiscall jrtplib::RTCPSDESPacket::GetItemData(RTCPSDESPacket *this)

{
  RTCPSDESHeader *sdeshdr;
  RTCPSDESPacket *this_local;
  
  if (((this->super_RTCPPacket).knownformat & 1U) == 0) {
    this_local = (RTCPSDESPacket *)0x0;
  }
  else if (this->currentchunk == (uint8_t *)0x0) {
    this_local = (RTCPSDESPacket *)0x0;
  }
  else if (this->currentchunk[this->itemoffset] == '\0') {
    this_local = (RTCPSDESPacket *)0x0;
  }
  else {
    this_local = (RTCPSDESPacket *)(this->currentchunk + this->itemoffset + 2);
  }
  return (uint8_t *)this_local;
}

Assistant:

inline uint8_t *RTCPSDESPacket::GetItemData()
{
	if (!knownformat)
		return 0;
	if (currentchunk == 0)
		return 0;
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+itemoffset);
	if (sdeshdr->sdesid == 0)
		return 0;
	return (currentchunk+itemoffset+sizeof(RTCPSDESHeader));
}